

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

int __thiscall Engine::init(Engine *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  IntVar *pIVar4;
  ulong uVar5;
  IntVar *local_30;
  
  uVar1 = (this->vars).sz;
  if (uVar1 != 0) {
    uVar5 = 0;
    pcVar3 = (char *)ctx;
    do {
      pIVar4 = (this->vars).data[uVar5];
      if ((pIVar4->pinfo).sz == 0) {
        pIVar4->in_queue = true;
      }
      else if (pIVar4->in_queue == false) {
        pIVar4->in_queue = true;
        pcVar3 = (char *)&local_30;
        local_30 = pIVar4;
        vec<IntVar_*>::push(&engine.v_queue,(IntVar **)&local_30);
        uVar1 = (this->vars).sz;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar1);
    ctx = (EVP_PKEY_CTX *)pcVar3;
    if (so.lazy == false) {
      if (uVar1 != 0) {
        uVar5 = 0;
        do {
          ctx = (EVP_PKEY_CTX *)0x1;
          IntVar::initVals((this->vars).data[uVar5],true);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (this->vars).sz);
      }
    }
    else if (uVar1 != 0) {
      uVar5 = 0;
      do {
        pIVar4 = (this->vars).data[uVar5];
        if (so.eager_limit < (pIVar4->max).v - (pIVar4->min).v) {
          if (1 < so.verbosity) {
            pcVar3 = "using lazy literal\n";
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"using lazy literal\n",0x13);
            pIVar4 = (this->vars).data[uVar5];
          }
          IntVar::specialiseToLL(pIVar4);
        }
        else {
          IntVar::specialiseToEL(pIVar4);
        }
        uVar5 = uVar5 + 1;
        ctx = (EVP_PKEY_CTX *)pcVar3;
      } while (uVar5 < (this->vars).sz);
    }
  }
  process_ircs();
  wf_init();
  if (so.mip == true) {
    MIP::init(mip,ctx);
  }
  SAT::init(&sat,ctx);
  iVar2 = (*this->problem->_vptr_Problem[1])();
  if (so.ldsb == true) {
    iVar2 = LDSB::init(&ldsb,ctx);
  }
  this->finished_init = true;
  return iVar2;
}

Assistant:

void Engine::init() {
	// Get the vars ready
	for (unsigned int i = 0; i < vars.size(); i++) {
		IntVar* v = vars[i];
		if (v->pinfo.size() == 0) {
			v->in_queue = true;
		} else {
			v->pushInQueue();
		}
	}

	if (so.lazy) {
		for (unsigned int i = 0; i < vars.size(); i++) {
			if (vars[i]->getMax() - vars[i]->getMin() <= so.eager_limit) {
				vars[i]->specialiseToEL();
			} else {
				if (so.verbosity >= 2) {
					std::cerr << "using lazy literal\n";
				}
				vars[i]->specialiseToLL();
			}
		}
	} else {
		for (unsigned int i = 0; i < vars.size(); i++) {
			vars[i]->initVals(true);
		}
	}

	// Get the propagators ready

	process_ircs();

	// Get well founded propagators ready

	wf_init();

	// Get MIP propagator ready

	if (so.mip) {
		mip->init();
	}

	// Get SAT propagator ready

	sat.init();

	// Set lits allowed to be in learnt clauses
	problem->restrict_learnable();

	// Get LDSB ready

	if (so.ldsb) {
		ldsb.init();
	}

	// Do MIP presolve

	if (so.mip) {
		mip->presolve();
	}

	// Ready

	finished_init = true;
}